

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O3

void __thiscall
spatial_region::fill_cell_by_particles
          (spatial_region *this,double cmr,int_vector3d *a,int_vector3d *b,double n,double ux0,
          double uy0,double dsplmt,double T)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  cellp *pcVar7;
  double dVar8;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  bool bVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  particle *p;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  undefined8 in_XMM0_Qb;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  double __x;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined8 in_XMM3_Qb;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  double dVar52;
  undefined1 in_register_00001348 [56];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined8 in_XMM9_Qb;
  int local_140;
  double local_b8;
  double dStack_b0;
  double local_58;
  double dStack_50;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  undefined1 extraout_var_01 [56];
  
  auVar53._8_56_ = in_register_00001348;
  auVar53._0_8_ = T;
  iVar22 = b->i;
  if (0 < iVar22) {
    iVar23 = b->j;
    iVar21 = b->k;
    auVar25 = ZEXT816(0) << 0x40;
    local_140 = 0;
    dVar52 = (double)iVar21;
    auVar50._0_8_ = 0.5 / (double)iVar23;
    auVar50._8_8_ = 0;
    auVar11._8_8_ = in_XMM0_Qb;
    auVar11._0_8_ = cmr;
    uVar13 = vcmpsd_avx512f(auVar11,auVar25,1);
    bVar15 = (bool)((byte)uVar13 & 1);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = 0.5 / (double)iVar22 + dsplmt;
    auVar33 = vunpcklpd_avx(auVar33,auVar50);
    auVar10._8_8_ = in_XMM3_Qb;
    auVar10._0_8_ = uy0;
    auVar17._8_8_ = in_XMM2_Qb;
    auVar17._0_8_ = ux0;
    dVar8 = (1.0 / (double)(iVar23 * iVar22 * iVar21)) * n;
    auVar18._8_8_ = 0x8000000000000000;
    auVar18._0_8_ = 0x8000000000000000;
    auVar24._8_8_ = 0;
    auVar24._0_8_ = dVar8;
    auVar24 = vxorpd_avx512vl(auVar24,auVar18);
    uVar13 = vcmppd_avx512vl(auVar11,auVar25,4);
    auVar10 = vunpcklpd_avx(auVar17,auVar10);
    uVar12 = vcmppd_avx512vl(auVar53._0_16_,auVar25,4);
    uVar14 = vcmpsd_avx512f(auVar11,auVar25,4);
    auVar25._8_8_ = 0;
    auVar25._0_8_ = uy0 * uy0;
    auVar18 = vfmadd231sd_fma(auVar25,auVar17,auVar17);
    auVar18 = vsqrtsd_avx(auVar18,auVar18);
    auVar17 = vfmadd213sd_fma(auVar18,auVar18,ZEXT816(0x3ff0000000000000));
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    dVar27 = auVar18._0_8_;
    auVar42._0_8_ = dVar27 / auVar17._0_8_;
    auVar42._8_8_ = auVar18._8_8_;
    auVar17 = vfnmadd213sd_fma(auVar42,auVar42,ZEXT816(0x3ff0000000000000));
    auVar18 = vsqrtsd_avx(auVar17,auVar17);
    __x = auVar17._0_8_;
    auVar17 = vsqrtsd_avx(auVar17,auVar17);
    do {
      if (0 < iVar23) {
        auVar34._0_8_ = (double)local_140;
        auVar34._8_8_ = in_XMM9_Qb;
        iVar22 = 0;
        do {
          if (0 < iVar21) {
            auVar35._0_8_ = (double)iVar22;
            auVar35._8_8_ = in_XMM9_Qb;
            iVar23 = 0;
            auVar11 = vunpcklpd_avx(auVar34,auVar35);
            do {
              p = new_particle(this);
              p->cmr = cmr;
              p->q = (double)((ulong)bVar15 * auVar24._0_8_ + (ulong)!bVar15 * (long)dVar8);
              uVar1 = b->i;
              uVar3 = b->j;
              auVar5._4_4_ = uVar3;
              auVar5._0_4_ = uVar1;
              auVar5._8_8_ = 0;
              auVar25 = vcvtdq2pd_avx(auVar5);
              uVar2 = a->i;
              uVar4 = a->j;
              auVar6._4_4_ = uVar4;
              auVar6._0_4_ = uVar2;
              auVar6._8_8_ = 0;
              auVar50 = vcvtdq2pd_avx(auVar6);
              local_58 = auVar33._0_8_;
              dStack_50 = auVar33._8_8_;
              auVar25 = vdivpd_avx(auVar11,auVar25);
              p->x = auVar50._0_8_ + local_58 + auVar25._0_8_;
              p->y = auVar50._8_8_ + dStack_50 + auVar25._8_8_;
              p->z = (double)a->k + 0.5 / dVar52 + (double)iVar23 / (double)b->k;
              if ((((byte)uVar13 & 3) & uVar12 & 1) == 0) {
                p->ux = ux0;
                p->uy = uy0;
                auVar38 = ZEXT816(0) << 0x40;
                auVar25 = auVar10;
              }
              else {
                do {
                  dVar28 = get_rand(this);
                  auVar43._8_8_ = 0;
                  auVar43._0_8_ = dVar28 * 5.0;
                  auVar25 = vfmadd213sd_fma(auVar43,auVar53._0_16_,ZEXT816(0x3ff0000000000000));
                  dVar30 = auVar25._0_8_;
                  dVar28 = get_rand(this);
                  auVar19._8_8_ = 0x8000000000000000;
                  auVar19._0_8_ = 0x8000000000000000;
                  auVar36._8_8_ = 0;
                  auVar36._0_8_ = dVar30 + -1.0;
                  auVar25 = vxorpd_avx512vl(auVar36,auVar19);
                  dVar29 = exp(auVar25._0_8_ / T);
                } while (dVar29 < dVar28);
                do {
                  do {
                    auVar39._0_8_ = get_rand(this);
                    auVar39._8_56_ = extraout_var;
                    auVar50 = vfmadd213sd_fma(auVar39._0_16_,ZEXT816(0x4000000000000000),
                                              ZEXT816(0xbff0000000000000));
                    auVar40._0_8_ = get_rand(this);
                    auVar40._8_56_ = extraout_var_00;
                    auVar25 = vfmadd213sd_fma(auVar40._0_16_,ZEXT816(0x4000000000000000),
                                              ZEXT816(0xbff0000000000000));
                    dVar28 = auVar25._0_8_;
                    auVar41._0_8_ = get_rand(this);
                    auVar41._8_56_ = extraout_var_01;
                    auVar47._8_8_ = 0;
                    auVar47._0_8_ = auVar50._0_8_;
                    auVar35 = vfmadd213sd_fma(auVar41._0_16_,ZEXT816(0x4000000000000000),
                                              ZEXT816(0xbff0000000000000));
                    auVar44._8_8_ = 0;
                    auVar44._0_8_ = dVar28 * dVar28;
                    auVar25 = vfmadd231sd_fma(auVar44,auVar47,auVar47);
                    auVar25 = vfmadd231sd_fma(auVar25,auVar35,auVar35);
                    auVar25 = vsqrtsd_avx(auVar25,auVar25);
                    dVar29 = auVar25._0_8_;
                  } while (1.0 < dVar29);
                } while ((dVar29 == 0.0) && (!NAN(dVar29)));
                dVar30 = 1.0 - 1.0 / (dVar30 * dVar30);
                if (dVar30 < 0.0) {
                  dVar30 = sqrt(dVar30);
                }
                else {
                  auVar37._8_8_ = 0;
                  auVar37._0_8_ = dVar30;
                  auVar25 = vsqrtsd_avx(auVar37,auVar37);
                  dVar30 = auVar25._0_8_;
                }
                dVar31 = auVar18._0_8_;
                if (__x < 0.0) {
                  dVar31 = sqrt(__x);
                }
                auVar56._8_8_ = 0;
                auVar56._0_8_ = auVar42._0_8_;
                dVar9 = (auVar50._0_8_ / dVar29) * dVar30;
                auVar55._8_8_ = 0;
                auVar55._0_8_ = dVar9;
                auVar25 = vfmadd213sd_fma(auVar56,auVar55,ZEXT816(0x3ff0000000000000));
                dVar16 = auVar25._0_8_;
                dVar32 = auVar17._0_8_;
                if (__x < 0.0) {
                  dVar32 = sqrt(__x);
                }
                auVar54._0_8_ = ((auVar35._0_8_ / dVar29) * dVar30 * dVar32) / dVar16;
                auVar54._8_8_ = 0;
                auVar48._0_8_ = ((dVar28 / dVar29) * dVar30 * dVar31) / dVar16;
                auVar48._8_8_ = 0;
                auVar45._0_8_ = (dVar9 + auVar42._0_8_) / dVar16;
                auVar45._8_8_ = 0;
                auVar25 = vfnmadd213sd_fma(auVar45,auVar45,ZEXT816(0x3ff0000000000000));
                auVar25 = vfnmadd231sd_fma(auVar25,auVar48,auVar48);
                auVar25 = vfnmadd231sd_fma(auVar25,auVar54,auVar54);
                if (auVar25._0_8_ < 0.0) {
                  dVar28 = sqrt(auVar25._0_8_);
                }
                else {
                  auVar25 = vsqrtsd_avx(auVar25,auVar25);
                  dVar28 = auVar25._0_8_;
                }
                dVar28 = 1.0 / dVar28;
                local_b8 = auVar10._0_8_;
                dStack_b0 = auVar10._8_8_;
                auVar20._8_8_ = dVar27;
                auVar20._0_8_ = dVar27;
                auVar38._8_8_ = 0;
                auVar38._0_8_ = auVar54._0_8_ * dVar28;
                auVar49._0_8_ = auVar48._0_8_ * dVar28 * local_b8;
                auVar49._8_8_ = auVar48._0_8_ * dVar28 * dStack_b0;
                auVar46._0_8_ = auVar45._0_8_ * dVar28 * local_b8;
                auVar46._8_8_ = auVar45._0_8_ * dVar28 * dStack_b0;
                auVar25 = vdivpd_avx(auVar49,auVar20);
                auVar50 = vdivpd_avx(auVar46,auVar20);
                auVar25 = vshufpd_avx(auVar25,auVar25,1);
                auVar25 = vaddsubpd_avx(auVar50,auVar25);
                p->ux = (double)auVar25._0_8_;
                p->uy = (double)auVar25._8_8_;
              }
              auVar50 = vshufpd_avx(auVar25,auVar25,1);
              p->uz = auVar38._0_8_;
              auVar51._8_8_ = 0;
              auVar51._0_8_ = auVar50._0_8_ * auVar50._0_8_;
              auVar35 = vfmadd231sd_fma(auVar51,auVar25,auVar25);
              auVar25 = vfmadd213sd_fma(auVar25,auVar25,ZEXT816(0x3ff0000000000000));
              auVar25 = vfmadd231sd_fma(auVar25,auVar50,auVar50);
              auVar26._0_8_ =
                   (ulong)((byte)uVar14 & 1) * auVar25._0_8_ +
                   (ulong)!(bool)((byte)uVar14 & 1) * auVar35._0_8_;
              auVar26._8_8_ = auVar35._8_8_;
              auVar25 = vfmadd231sd_fma(auVar26,auVar38,auVar38);
              auVar25 = vsqrtsd_avx(auVar25,auVar25);
              p->g = auVar25._0_8_;
              p->chi = 0.0;
              p->trn = 0;
              place(this,p);
              iVar21 = b->k;
              iVar23 = iVar23 + 1;
            } while (iVar23 < iVar21);
            iVar23 = b->j;
          }
          iVar22 = iVar22 + 1;
        } while (iVar22 < iVar23);
        iVar22 = b->i;
      }
      local_140 = local_140 + 1;
    } while (local_140 < iVar22);
  }
  pcVar7 = (this->cp).p._M_t.super___uniq_ptr_impl<cellp_**,_std::default_delete<cellp_**[]>_>._M_t.
           super__Tuple_impl<0UL,_cellp_***,_std::default_delete<cellp_**[]>_>.
           super__Head_base<0UL,_cellp_***,_false>._M_head_impl[a->i][a->j];
  pcVar7[a->k].pl.start = pcVar7[a->k].pl.head;
  return;
}

Assistant:

void spatial_region::fill_cell_by_particles(double cmr, int_vector3d& a, int_vector3d& b, double n, double ux0, double uy0, double dsplmt, double T)
{
    // a = {i,j,k} - cell position, b = {xnpic,ynpic,znpic}, n - density
    double x0;
    double y0;
    double z0;
    double q0;
    particle* tmp_p;
    x0 = 0.5/b.i + dsplmt;
    y0 = 0.5/b.j;
    z0 = 0.5/b.k;
    q0 = 1/double(b.i*b.j*b.k)*n;
    if (cmr<0) q0 = -q0;
    for(int ip=0;ip<b.i;ip++)
    {
        for(int jp=0;jp<b.j;jp++)
        {
            for(int kp=0;kp<b.k;kp++)
            {
                tmp_p = new_particle();
                // initial conditions
                tmp_p->cmr = cmr;
                tmp_p->q = q0;
                tmp_p->x = x0 + double(a.i) + double(ip)/double(b.i);
                tmp_p->y = y0 + double(a.j) + double(jp)/double(b.j);
                tmp_p->z = z0 + double(a.k) + double(kp)/double(b.k);
                if ( T!=0 && cmr!=0 ){
                    double u0 = sqrt( ux0*ux0 + uy0*uy0 );
                    double v0 = u0 / sqrt( 1 + u0*u0 );
                    double a, b, c, r, gamma, v;
                    // gives gamma with approximately e^(-(x-1)/T) distribution
                    do {
                        gamma = 1 + get_rand() * 5 * T;
                    } while ( get_rand() > exp( -(gamma - 1) / T));
                    // gives random direction (uniform)
                    do {
                        a = 2*get_rand()-1;
                        b = 2*get_rand()-1;
                        c = 2*get_rand()-1;
                        r = sqrt( a*a + b*b + c*c );
                    } while ( r > 1 || r == 0);
                    a = a / r;
                    b = b / r;
                    c = c / r;
                    // (a, b, c) now is the random vector uniformly distributed on a unit
                    // sphere
                    v = sqrt(1 - 1 / (gamma * gamma));
                    a = v * a; // vx'
                    b = v * b; // vy'
                    c = v * c; // vz'
                    // Lorentz transformation to lab reference frame
                    b = b*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    c = c*sqrt( 1 - v0*v0 )/( 1 + a*v0 );
                    a = ( a + v0 )/( 1 + a*v0 );
                    double g = 1/sqrt( 1 - a*a - b*b - c*c );
                    tmp_p->ux = a*g*ux0/u0 - b*g*uy0/u0;
                    tmp_p->uy = a*g*uy0/u0 + b*g*ux0/u0;
                    tmp_p->uz = c*g;
                } else {
                    tmp_p->ux = ux0;
                    tmp_p->uy = uy0;
                    tmp_p->uz = 0;
                }
                if (cmr!=0)
                    tmp_p->g = sqrt(1 + (*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                else
                    tmp_p->g = sqrt((*tmp_p).ux*(*tmp_p).ux + (*tmp_p).uy*(*tmp_p).uy + (*tmp_p).uz*(*tmp_p).uz);
                #ifndef QUILL_NOQED
                tmp_p->chi = 0;
                #endif
                tmp_p->trn = 0;
                place(*tmp_p);
            }
        }
    }
    cp[a.i][a.j][a.k].pl.start = cp[a.i][a.j][a.k].pl.head;
}